

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void __thiscall Fl_Shared_Image::release(Fl_Shared_Image *this)

{
  int local_14;
  int i;
  Fl_Shared_Image *this_local;
  
  this->refcount_ = this->refcount_ + -1;
  if (this->refcount_ < 1) {
    for (local_14 = 0; local_14 < num_images_; local_14 = local_14 + 1) {
      if (images_[local_14] == this) {
        num_images_ = num_images_ + -1;
        if (local_14 < num_images_) {
          memmove(images_ + local_14,images_ + (long)local_14 + 1,
                  (long)(num_images_ - local_14) << 3);
        }
        break;
      }
    }
    if (this != (Fl_Shared_Image *)0x0) {
      (*(this->super_Fl_Image)._vptr_Fl_Image[1])();
    }
    if ((num_images_ == 0) && (images_ != (Fl_Shared_Image **)0x0)) {
      if (images_ != (Fl_Shared_Image **)0x0) {
        operator_delete__(images_);
      }
      images_ = (Fl_Shared_Image **)0x0;
      alloc_images_ = 0;
    }
  }
  return;
}

Assistant:

void Fl_Shared_Image::release() {
  int	i;	// Looping var...

  refcount_ --;
  if (refcount_ > 0) return;

  for (i = 0; i < num_images_; i ++)
    if (images_[i] == this) {
      num_images_ --;

      if (i < num_images_) {
        memmove(images_ + i, images_ + i + 1,
               (num_images_ - i) * sizeof(Fl_Shared_Image *));
      }

      break;
    }

  delete this;

  if (num_images_ == 0 && images_) {
    delete[] images_;

    images_       = 0;
    alloc_images_ = 0;
  }
}